

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double discrete_cdf(int x,int a,double *b)

{
  double dVar1;
  double dVar2;
  
  if (0 < x) {
    if (x < a) {
      dVar1 = r8vec_sum(x,b);
      dVar2 = r8vec_sum(a,b);
      dVar1 = dVar1 / dVar2;
    }
    else {
      dVar1 = 1.0;
    }
    return dVar1;
  }
  return 0.0;
}

Assistant:

double discrete_cdf ( int x, int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_CDF evaluates the Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the item whose probability is desired.
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of outcomes
//    1 through A.  Each entry must be nonnegative.
//
//    Output, double DISCRETE_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < 1 )
  {
    cdf = 0.0;
  }
  else if ( x < a )
  {
    cdf = r8vec_sum ( x, b ) / r8vec_sum ( a, b );
  }
  else if ( a <= x )
  {
    cdf = 1.0;
  }

  return cdf;
}